

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

void js_promise_finalizer(JSRuntime *rt,JSValue val)

{
  JSValue v;
  JSValue obj;
  JSRuntime *pJVar1;
  void *pvVar2;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSPromiseReactionData *rd;
  int i;
  list_head *el1;
  list_head *el;
  JSPromiseData *s;
  JSPromiseReactionData *in_stack_ffffffffffffffb8;
  JSRuntime *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar3;
  JSRuntime *in_stack_ffffffffffffffd0;
  JSRuntime *local_28;
  
  obj.tag = in_RDX;
  obj.u.float64 = in_RSI.float64;
  pvVar2 = JS_GetOpaque(obj,0x2a);
  if (pvVar2 != (void *)0x0) {
    for (iVar3 = 0; iVar3 < 2; iVar3 = iVar3 + 1) {
      local_28 = *(JSRuntime **)((long)pvVar2 + (long)iVar3 * 0x10 + 0x10);
      pJVar1 = (JSRuntime *)(local_28->mf).js_free;
      while (in_stack_ffffffffffffffd0 = pJVar1,
            local_28 != (JSRuntime *)((long)pvVar2 + (long)iVar3 * 0x10 + 8)) {
        promise_reaction_data_free(local_28,in_stack_ffffffffffffffb8);
        in_stack_ffffffffffffffc0 = local_28;
        pJVar1 = (JSRuntime *)(in_stack_ffffffffffffffd0->mf).js_free;
        local_28 = in_stack_ffffffffffffffd0;
      }
    }
    v.u._4_4_ = iVar3;
    v.u.int32 = in_stack_ffffffffffffffc8;
    v.tag = (int64_t)in_stack_ffffffffffffffd0;
    JS_FreeValueRT(in_stack_ffffffffffffffc0,v);
    js_free_rt(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

static void js_promise_finalizer(JSRuntime *rt, JSValue val)
{
    JSPromiseData *s = JS_GetOpaque(val, JS_CLASS_PROMISE);
    struct list_head *el, *el1;
    int i;

    if (!s)
        return;
    for(i = 0; i < 2; i++) {
        list_for_each_safe(el, el1, &s->promise_reactions[i]) {
            JSPromiseReactionData *rd =
                list_entry(el, JSPromiseReactionData, link);
            promise_reaction_data_free(rt, rd);
        }
    }
    JS_FreeValueRT(rt, s->promise_result);
    js_free_rt(rt, s);
}